

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_zip.c
# Opt level: O1

wchar_t zip_read_data_zipx_ppmd(archive_read *a,void **buff,size_t *size,int64_t *offset)

{
  CPpmd8 *p_00;
  byte bVar1;
  byte bVar2;
  zip *zip;
  bool bVar3;
  Bool BVar4;
  int iVar5;
  wchar_t wVar6;
  byte *pbVar7;
  uchar *puVar8;
  uint size_00;
  ulong uVar9;
  uint maxOrder;
  uchar *p;
  ssize_t bytes_avail;
  ssize_t local_38;
  
  zip = (zip *)a->format->data;
  local_38 = 0;
  if (zip->decompress_init != '\0') goto LAB_00160d24;
  if (zip->ppmd8_valid != '\0') {
    Ppmd8_Free(&zip->ppmd8);
    zip->ppmd8_valid = '\0';
  }
  p_00 = &zip->ppmd8;
  Ppmd8_Construct(p_00);
  zip->ppmd8_stream_failed = '\0';
  (zip->ppmd8).Stream.In = &zip->zipx_ppmd_stream;
  (zip->zipx_ppmd_stream).a = a;
  (zip->zipx_ppmd_stream).Read = ppmd_read;
  zip->zipx_ppmd_read_compressed = 0;
  pbVar7 = (byte *)__archive_read_ahead(a,2,(ssize_t *)0x0);
  if (pbVar7 == (byte *)0x0) {
    bVar3 = false;
    archive_set_error(&a->archive,0x54,"Truncated file data in PPMd8 stream");
    wVar6 = L'\xffffffe2';
  }
  else {
    __archive_read_consume(a,2);
    bVar1 = pbVar7[1];
    bVar2 = *pbVar7;
    maxOrder = (bVar2 & 0xf) + 1;
    if (bVar1 < 0x30 && (bVar2 & 0xf) != 0) {
      size_00 = (((uint)bVar2 << 0x10 | (uint)bVar1 << 0x18) & 0xff00000) + 0x100000;
      BVar4 = Ppmd8_Alloc(p_00,size_00);
      if (BVar4 == 0) {
        archive_set_error(&a->archive,0xc,"Unable to allocate memory for PPMd8 stream: %d bytes",
                          (ulong)size_00);
      }
      else {
        zip->ppmd8_valid = '\x01';
        BVar4 = Ppmd8_RangeDec_Init(p_00);
        if (BVar4 != 0) {
          Ppmd8_Init(p_00,maxOrder,(uint)(bVar1 >> 4));
          free(zip->uncompressed_buffer);
          zip->uncompressed_buffer_size = 0x40000;
          puVar8 = (uchar *)malloc(0x40000);
          zip->uncompressed_buffer = puVar8;
          if (puVar8 == (uchar *)0x0) {
            bVar3 = false;
            archive_set_error(&a->archive,0xc,"No memory for PPMd8 decompression");
            wVar6 = L'\xffffffe2';
          }
          else {
            zip->decompress_init = '\x01';
            zip->entry_compressed_bytes_read =
                 zip->entry_compressed_bytes_read + zip->zipx_ppmd_read_compressed + 2;
            wVar6 = L'\0';
            bVar3 = true;
          }
          goto LAB_00160d1b;
        }
        archive_set_error(&a->archive,0x16,"PPMd8 stream range decoder initialization error");
      }
      wVar6 = L'\xffffffe2';
    }
    else {
      archive_set_error(&a->archive,0x54,
                        "Invalid parameter set in PPMd8 stream (order=%d, restore=%d)",
                        (ulong)maxOrder,(ulong)(uint)(bVar1 >> 4));
      wVar6 = L'\xffffffe7';
    }
    bVar3 = false;
  }
LAB_00160d1b:
  if (!bVar3) {
    return wVar6;
  }
LAB_00160d24:
  __archive_read_ahead(a,1,&local_38);
  if (local_38 < 0) {
    archive_set_error(&a->archive,0x54,"Truncated PPMd8 file body");
LAB_00160e44:
    wVar6 = L'\xffffffe2';
  }
  else {
    zip->zipx_ppmd_read_compressed = 0;
    uVar9 = 0;
    do {
      iVar5 = Ppmd8_DecodeSymbol(&zip->ppmd8);
      if (iVar5 < 0) {
        zip->end_of_entry = '\x01';
        iVar5 = 2;
      }
      else if (zip->ppmd8_stream_failed == '\0') {
        zip->uncompressed_buffer[uVar9] = (uchar)iVar5;
        uVar9 = uVar9 + 1;
        iVar5 = 0;
      }
      else {
        archive_set_error(&a->archive,0x54,"Truncated PPMd8 file body");
        iVar5 = 1;
      }
      if (iVar5 != 0) {
        if (iVar5 != 2) goto LAB_00160e44;
        break;
      }
    } while (uVar9 < zip->uncompressed_buffer_size);
    *buff = zip->uncompressed_buffer;
    *size = uVar9;
    zip->entry_bytes_remaining = zip->entry_bytes_remaining - zip->zipx_ppmd_read_compressed;
    zip->entry_compressed_bytes_read =
         zip->entry_compressed_bytes_read + zip->zipx_ppmd_read_compressed;
    zip->entry_uncompressed_bytes_read = zip->entry_uncompressed_bytes_read + uVar9;
    if (zip->end_of_entry != '\0') {
      Ppmd8_Free(&zip->ppmd8);
      zip->ppmd8_valid = '\0';
    }
    wVar6 = consume_optional_marker(a,zip);
  }
  return wVar6;
}

Assistant:

static int
zip_read_data_zipx_ppmd(struct archive_read *a, const void **buff,
    size_t *size, int64_t *offset)
{
	struct zip* zip = (struct zip *)(a->format->data);
	int ret;
	size_t consumed_bytes = 0;
	ssize_t bytes_avail = 0;

	(void) offset; /* UNUSED */

	/* If we're here for the first time, initialize Ppmd8 decompression
	 * context first. */
	if(!zip->decompress_init) {
		ret = zipx_ppmd8_init(a, zip);
		if(ret != ARCHIVE_OK)
			return ret;
	}

	/* Fetch for more data. We're reading 1 byte here, but libarchive
	 * should prefetch more bytes. */
	(void) __archive_read_ahead(a, 1, &bytes_avail);
	if(bytes_avail < 0) {
		archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
		    "Truncated PPMd8 file body");
		return (ARCHIVE_FATAL);
	}

	/* This counter will be updated inside ppmd_read(), which at one
	 * point will be called by Ppmd8_DecodeSymbol. */
	zip->zipx_ppmd_read_compressed = 0;

	/* Decompression loop. */
	do {
		int sym = __archive_ppmd8_functions.Ppmd8_DecodeSymbol(
		    &zip->ppmd8);
		if(sym < 0) {
			zip->end_of_entry = 1;
			break;
		}

		/* This field is set by ppmd_read() when there was no more data
		 * to be read. */
		if(zip->ppmd8_stream_failed) {
			archive_set_error(&a->archive,
			    ARCHIVE_ERRNO_FILE_FORMAT,
			    "Truncated PPMd8 file body");
			return (ARCHIVE_FATAL);
		}

		zip->uncompressed_buffer[consumed_bytes] = (uint8_t) sym;
		++consumed_bytes;
	} while(consumed_bytes < zip->uncompressed_buffer_size);

	/* Update pointers for libarchive. */
	*buff = zip->uncompressed_buffer;
	*size = consumed_bytes;

	/* Update pointers so we can continue decompression in another call. */
	zip->entry_bytes_remaining -= zip->zipx_ppmd_read_compressed;
	zip->entry_compressed_bytes_read += zip->zipx_ppmd_read_compressed;
	zip->entry_uncompressed_bytes_read += consumed_bytes;

	/* If we're at the end of stream, deinitialize Ppmd8 context. */
	if(zip->end_of_entry) {
		__archive_ppmd8_functions.Ppmd8_Free(&zip->ppmd8);
		zip->ppmd8_valid = 0;
	}

	/* Seek for optional marker, same way as in each zip entry. */
	ret = consume_optional_marker(a, zip);
	if (ret != ARCHIVE_OK)
		return ret;

	return ARCHIVE_OK;
}